

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildArgExpList(CNscPStackEntry *pList,CNscPStackEntry *pArg)

{
  CNwnDoubleLinkList *pCVar1;
  CNscPStackEntry *pCVar2;
  CNscContext *pCVar3;
  CNwnDoubleLinkList *pCVar4;
  
  if (pList == (CNscPStackEntry *)0x0) {
    pList = CNscContext::GetPStackEntryInt(g_pCtx);
    if (pList->m_nType != NscType_Unknown) goto LAB_00151dc7;
    pList->m_nType = NscType_Unknown;
  }
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pArg == (CNscPStackEntry *)0x0) {
      return pList;
    }
  }
  else if (pList->m_nType != NscType_Error) {
    if (pArg->m_nType == NscType_Error) {
      if (pList->m_nType != NscType_Unknown) {
LAB_00151dc7:
        __assert_fail("m_nType == NscType_Unknown",
                      "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                      ,0xee,"void CNscPStackEntry::SetType(NscType)");
      }
      pList->m_nType = NscType_Error;
    }
    else {
      CNscPStackEntry::PushArgument(pList,pArg->m_nType,pArg->m_pauchData,pArg->m_nDataSize);
    }
  }
  pCVar3 = g_pCtx;
  pCVar1 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar2 = (CNscPStackEntry *)(pArg->m_link).m_pNext;
  if (pCVar2 != pArg) {
    pCVar4 = (pArg->m_link).m_pPrev;
    (pCVar2->m_link).m_pPrev = pCVar4;
    pCVar4->m_pNext = (CNwnDoubleLinkList *)pCVar2;
    (pArg->m_link).m_pNext = &pArg->m_link;
    (pArg->m_link).m_pPrev = &pArg->m_link;
  }
  pCVar4 = &pCVar3->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar3->m_listEntryFree == pArg) {
    pCVar4 = pCVar1;
  }
  pCVar1 = pCVar4->m_pNext;
  (pArg->m_link).m_pNext = pCVar1;
  (pArg->m_link).m_pPrev = pCVar4;
  pCVar4->m_pNext = &pArg->m_link;
  pCVar1->m_pPrev = &pArg->m_link;
  return pList;
}

Assistant:

YYSTYPE NscBuildArgExpList (YYSTYPE pList, YYSTYPE pArg)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pArg)
			g_pCtx ->FreePStackEntry (pArg);
		return pOut;
	}
	
	//
	// Process the argument
	//

	if (pOut ->GetType () != NscType_Error)
	{
		if (pArg ->GetType () != NscType_Error)
		{
			pOut ->PushArgument (pArg ->GetType (),
				pArg ->GetData (), pArg ->GetDataSize ());
		}
		else
			pOut ->SetType (NscType_Error);
	}
    g_pCtx ->FreePStackEntry (pArg);

	//
	// Return the new argument list
	//

	return pOut;
}